

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int jx9Vfs_mkdir(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  void *pvVar1;
  int iVar2;
  char *pcVar3;
  jx9_value *pjVar4;
  undefined4 uVar5;
  anon_union_8_3_18420de5_for_x aVar6;
  undefined4 uVar7;
  
  if ((0 < nArg) && (((*apArg)->iFlags & 1) != 0)) {
    pvVar1 = pCtx->pFunc->pUserData;
    if ((pvVar1 != (void *)0x0) && (*(long *)((long)pvVar1 + 0x28) != 0)) {
      uVar7 = 0;
      pcVar3 = jx9_value_to_string(*apArg,(int *)0x0);
      uVar5 = 0x1ff;
      if (nArg != 1) {
        pjVar4 = apArg[1];
        jx9MemObjToInteger(pjVar4);
        uVar5 = *(undefined4 *)&pjVar4->x;
        if (2 < (uint)nArg) {
          pjVar4 = apArg[2];
          jx9MemObjToBool(pjVar4);
          uVar7 = *(undefined4 *)&pjVar4->x;
        }
      }
      iVar2 = (**(code **)((long)pvVar1 + 0x28))(pcVar3,uVar5,uVar7);
      aVar6.iVal._1_7_ = 0;
      aVar6.iVal._0_1_ = iVar2 == 0;
      pjVar4 = pCtx->pRet;
      jx9MemObjRelease(pjVar4);
      pjVar4->x = aVar6;
      goto LAB_00139adb;
    }
    jx9_context_throw_error_format
              (pCtx,2,"IO routine(%s) not implemented in the underlying VFS, JX9 is returning FALSE"
               ,(pCtx->pFunc->sName).zString);
  }
  pjVar4 = pCtx->pRet;
  jx9MemObjRelease(pjVar4);
  (pjVar4->x).rVal = 0.0;
LAB_00139adb:
  pjVar4->iFlags = pjVar4->iFlags & 0xfffffe90U | 8;
  return 0;
}

Assistant:

static int jx9Vfs_mkdir(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	int iRecursive = 0;
	const char *zPath;
	jx9_vfs *pVfs;
	int iMode, rc;
	if( nArg < 1 || !jx9_value_is_string(apArg[0]) ){
		/* Missing/Invalid argument, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Point to the underlying vfs */
	pVfs = (jx9_vfs *)jx9_context_user_data(pCtx);
	if( pVfs == 0 || pVfs->xMkdir == 0 ){
		/* IO routine not implemented, return NULL */
		jx9_context_throw_error_format(pCtx, JX9_CTX_WARNING, 
			"IO routine(%s) not implemented in the underlying VFS, JX9 is returning FALSE", 
			jx9_function_name(pCtx)
			);
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Point to the desired directory */
	zPath = jx9_value_to_string(apArg[0], 0);
#ifdef __WINNT__
	iMode = 0;
#else
	/* Assume UNIX */
	iMode = 0777;
#endif
	if( nArg > 1 ){
		iMode = jx9_value_to_int(apArg[1]);
		if( nArg > 2 ){
			iRecursive = jx9_value_to_bool(apArg[2]);
		}
	}
	/* Perform the requested operation */
	rc = pVfs->xMkdir(zPath, iMode, iRecursive);
	/* IO return value */
	jx9_result_bool(pCtx, rc == JX9_OK);
	return JX9_OK;
}